

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O0

void __thiscall QHttp2Stream::transitionState(QHttp2Stream *this,StateTransition transition)

{
  QHttp2Stream *this_00;
  int in_ESI;
  long in_RDI;
  State newState;
  
  this_00 = (QHttp2Stream *)(ulong)*(uint *)(in_RDI + 0x68);
  newState = (State)((ulong)in_RDI >> 0x20);
  switch(this_00) {
  case (QHttp2Stream *)0x0:
    if (in_ESI == 0) {
      setState(this_00,newState);
    }
    break;
  case (QHttp2Stream *)0x1:
    if (in_ESI == 3) {
      setState(this_00,newState);
    }
    else if (in_ESI == 1) {
      setState(this_00,newState);
    }
    break;
  case (QHttp2Stream *)0x2:
    switch(in_ESI) {
    case 0:
      break;
    case 1:
      setState(this_00,newState);
      break;
    case 2:
      setState(this_00,newState);
      break;
    case 3:
      setState(this_00,newState);
    }
    break;
  case (QHttp2Stream *)0x3:
    if ((in_ESI == 2) || (in_ESI == 3)) {
      setState(this_00,newState);
    }
    break;
  case (QHttp2Stream *)0x4:
    if ((in_ESI == 1) || (in_ESI == 3)) {
      setState(this_00,newState);
    }
    break;
  case (QHttp2Stream *)0x5:
  }
  return;
}

Assistant:

void QHttp2Stream::transitionState(StateTransition transition)
{
    switch (m_state) {
    case State::Idle:
        if (transition == StateTransition::Open)
            setState(State::Open);
        else
            Q_UNREACHABLE(); // We should transition to Open before ever getting here
        break;
    case State::Open:
        switch (transition) {
        case StateTransition::CloseLocal:
            setState(State::HalfClosedLocal);
            break;
        case StateTransition::CloseRemote:
            setState(State::HalfClosedRemote);
            break;
        case StateTransition::RST:
            setState(State::Closed);
            break;
        case StateTransition::Open: // no-op
            break;
        }
        break;
    case State::HalfClosedLocal:
        if (transition == StateTransition::CloseRemote || transition == StateTransition::RST)
            setState(State::Closed);
        break;
    case State::HalfClosedRemote:
        if (transition == StateTransition::CloseLocal || transition == StateTransition::RST)
            setState(State::Closed);
        break;
    case State::ReservedRemote:
        if (transition == StateTransition::RST) {
            setState(State::Closed);
        } else if (transition == StateTransition::CloseLocal) { // Receiving HEADER closes local
            setState(State::HalfClosedLocal);
        }
        break;
    case State::Closed:
        break;
    }
}